

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O1

int check_flow_timeout(pcp_flow_t *f,void *timeout)

{
  undefined1 auVar1 [16];
  __time_t _Var2;
  int iVar3;
  long lVar4;
  long lVar5;
  timeval ctv;
  timeval local_38;
  
  if (((f->timeout).tv_sec != 0) || ((f->timeout).tv_usec != 0)) {
    gettimeofday(&local_38,(__timezone_ptr_t)0x0);
    lVar4 = (f->timeout).tv_usec;
    lVar5 = lVar4 / 1000000 + (f->timeout).tv_sec;
    (f->timeout).tv_sec = lVar5;
    lVar4 = lVar4 % 1000000;
    (f->timeout).tv_usec = lVar4;
    if (lVar4 < 0) {
      (f->timeout).tv_usec = lVar4 + 1000000;
      (f->timeout).tv_sec = lVar5 + -1;
    }
    local_38.tv_sec = local_38.tv_usec / 1000000 + local_38.tv_sec;
    local_38.tv_usec = local_38.tv_usec % 1000000;
    if (local_38.tv_usec < 0) {
      local_38.tv_usec = local_38.tv_usec + 1000000;
      local_38.tv_sec = local_38.tv_sec + -1;
    }
    _Var2 = local_38.tv_sec;
    lVar4 = (f->timeout).tv_sec;
    if ((lVar4 < local_38.tv_sec) ||
       ((lVar4 <= local_38.tv_sec && ((f->timeout).tv_usec <= local_38.tv_usec)))) {
      if (f->state == pfs_wait_resp) {
        pcp_logger(PCP_LOGLVL_WARN,"Recv of PCP response for flow %d timed out.",
                   (ulong)f->key_bucket);
      }
      handle_flow_event(f,fev_flow_timedout,(pcp_recv_msg_t *)0x0);
    }
    lVar4 = (f->timeout).tv_sec;
    if ((lVar4 != 0) || ((f->timeout).tv_usec != 0)) {
      lVar5 = (f->timeout).tv_usec;
      lVar4 = lVar4 + lVar5 / 1000000;
      (f->timeout).tv_sec = lVar4;
      lVar5 = lVar5 % 1000000;
      (f->timeout).tv_usec = lVar5;
      if (lVar5 < 0) {
        (f->timeout).tv_usec = lVar5 + 1000000;
        (f->timeout).tv_sec = lVar4 + -1;
      }
      local_38.tv_sec = _Var2 + local_38.tv_usec / 1000000;
      local_38.tv_usec = local_38.tv_usec % 1000000;
      if (local_38.tv_usec < 0) {
        local_38.tv_usec = local_38.tv_usec + 1000000;
        local_38.tv_sec = local_38.tv_sec + -1;
      }
      lVar4 = (f->timeout).tv_sec;
      if ((lVar4 < local_38.tv_sec) ||
         ((lVar4 <= local_38.tv_sec && ((f->timeout).tv_usec <= local_38.tv_usec)))) {
        local_38.tv_sec = 0;
        local_38.tv_usec = 0;
      }
      else {
        lVar5 = (f->timeout).tv_usec;
        if (local_38.tv_usec - lVar5 != 0 && lVar5 <= local_38.tv_usec) {
          auVar1 = SEXT816(local_38.tv_usec - lVar5) * SEXT816(0x431bde82d7b634db);
          iVar3 = ((int)(auVar1._8_8_ >> 0x12) - (auVar1._12_4_ >> 0x1f)) + 1;
          local_38.tv_usec = local_38.tv_usec - iVar3 * 1000000;
          local_38.tv_sec = local_38.tv_sec + iVar3;
        }
        local_38.tv_sec = (lVar4 - local_38.tv_sec) + (lVar5 - local_38.tv_usec) / 1000000;
        local_38.tv_usec = (lVar5 - local_38.tv_usec) % 1000000;
        if (local_38.tv_usec < 0) {
          local_38.tv_usec = local_38.tv_usec + 1000000;
          local_38.tv_sec = local_38.tv_sec + -1;
        }
      }
      if ((*timeout != 0) || (*(long *)((long)timeout + 8) != 0)) {
        local_38.tv_sec = local_38.tv_usec / 1000000 + local_38.tv_sec;
        local_38.tv_usec = local_38.tv_usec % 1000000;
        if (local_38.tv_usec < 0) {
          local_38.tv_usec = local_38.tv_usec + 1000000;
          local_38.tv_sec = local_38.tv_sec + -1;
        }
        lVar5 = *timeout + *(long *)((long)timeout + 8) / 1000000;
        *(long *)timeout = lVar5;
        lVar4 = *(long *)((long)timeout + 8) % 1000000;
        *(long *)((long)timeout + 8) = lVar4;
        if (lVar4 < 0) {
          *(long *)((long)timeout + 8) = lVar4 + 1000000;
          *(long *)timeout = lVar5 + -1;
        }
        if (*timeout <= local_38.tv_sec) {
          if (*timeout < local_38.tv_sec) {
            return 0;
          }
          if (*(long *)((long)timeout + 8) <= local_38.tv_usec) {
            return 0;
          }
        }
      }
      *(__time_t *)timeout = local_38.tv_sec;
      *(__suseconds_t *)((long)timeout + 8) = local_38.tv_usec;
    }
  }
  return 0;
}

Assistant:

static int check_flow_timeout(pcp_flow_t *f, void *timeout) {
    struct timeval *tout = timeout;
    struct timeval ctv;

    if ((f->timeout.tv_sec == 0) && (f->timeout.tv_usec == 0)) {
        return 0;
    }

    gettimeofday(&ctv, NULL);
    if (timeval_comp(&f->timeout, &ctv) <= 0) {
        // timed out
        if (f->state == pfs_wait_resp) {
            PCP_LOG(PCP_LOGLVL_WARN,
                    "Recv of PCP response for flow %d timed out.",
                    f->key_bucket);
        }
        handle_flow_event(f, fev_flow_timedout, NULL);
    }

    if ((f->timeout.tv_sec == 0) && (f->timeout.tv_usec == 0)) {
        return 0;
    }

    timeval_subtract(&ctv, &f->timeout, &ctv);

    if ((tout->tv_sec == 0) && (tout->tv_usec == 0)) {
        *tout = ctv;
        return 0;
    }

    if (timeval_comp(&ctv, tout) < 0) {
        *tout = ctv;
    }

    return 0;
}